

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.cc
# Opt level: O2

void __thiscall
VW::config::options_serializer_boost_po::add_impl<VW::config::typelist<>>
          (options_serializer_boost_po *this,base_option *options)

{
  vw_exception *this_00;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_190,"That is an unsupported option type.");
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/options_serializer_boost_po.cc"
             ,0x19,&local_1c0);
  __cxa_throw(this_00,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void options_serializer_boost_po::add_impl<typelist<>>(base_option& options)
{
  THROW("That is an unsupported option type.");
}